

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_long,char_const(&)[16],unsigned_int_const&,unsigned_int_const&,std::__cxx11::string>
          (ValidationContext *this,IssueError *issue,uint *args,unsigned_long *args_1,
          char (*args_2) [16],uint *args_3,uint *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  char *pcVar1;
  string_view fmt;
  format_args args_00;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  ulong local_98 [2];
  unsigned_long local_88;
  char (*local_78) [16];
  ulong local_68;
  ulong local_58;
  pointer local_48;
  size_type sStack_40;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_e0[0] = (issue->super_Issue).type;
  local_e0._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_d8._M_p = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_98[0] = (ulong)*args;
  local_88 = *args_1;
  local_68 = (ulong)*args_3;
  local_58 = (ulong)*args_4;
  local_48 = (args_5->_M_dataplus)._M_p;
  sStack_40 = args_5->_M_string_length;
  fmt.size_ = 0xd22c42;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1._0_4_ = *args_3;
  args_00.desc_ = (unsigned_long_long)local_98;
  args_00.field_1._4_4_ = 0;
  local_78 = args_2;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_b8,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }